

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::BlockStatement::tokenize(BlockStatement *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *pTVar1;
  __normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>
  __tmp;
  pointer ppSVar2;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30.m_type = LEFT_BRACE;
  pTVar1 = TokenStream::operator<<(str,&local_30);
  local_40.m_type = NEWLINE;
  pTVar1 = TokenStream::operator<<(pTVar1,&local_40);
  local_50.m_type = INDENT_INC;
  TokenStream::operator<<(pTVar1,&local_50);
  Token::~Token(&local_50);
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  for (ppSVar2 = (this->m_children).
                 super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppSVar2 !=
      (this->m_children).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>.
      _M_impl.super__Vector_impl_data._M_start; ppSVar2 = ppSVar2 + -1) {
    (*ppSVar2[-1]->_vptr_Statement[3])(ppSVar2[-1],state,str);
  }
  local_30.m_type = INDENT_DEC;
  pTVar1 = TokenStream::operator<<(str,&local_30);
  local_40.m_type = RIGHT_BRACE;
  pTVar1 = TokenStream::operator<<(pTVar1,&local_40);
  local_50.m_type = NEWLINE;
  TokenStream::operator<<(pTVar1,&local_50);
  Token::~Token(&local_50);
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  return;
}

Assistant:

void BlockStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token::LEFT_BRACE << Token::NEWLINE << Token::INDENT_INC;

	for (vector<Statement*>::const_reverse_iterator i = m_children.rbegin(); i != m_children.rend(); i++)
		(*i)->tokenize(state, str);

	str << Token::INDENT_DEC << Token::RIGHT_BRACE << Token::NEWLINE;
}